

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrismExtend.cpp
# Opt level: O2

int pztopology::Pr<pztopology::Pr<pztopology::TPZPoint>_>::ContainedSideLocId(int side,int c)

{
  int iVar1;
  ostream *poVar2;
  int iVar3;
  int side_00;
  
  side_00 = side % 3;
  iVar1 = 9;
  if (side_00 < 2) {
    iVar1 = 3;
  }
  iVar3 = (1 < side_00) + 1 + (uint)(1 < side_00);
  if (side < 6) {
    iVar1 = iVar3;
  }
  if (c < iVar1) {
    if (side + 2U < 5) {
      iVar1 = Pr<pztopology::TPZPoint>::ContainedSideLocId(side_00,c);
      return iVar1;
    }
    if (side - 3U < 3) {
      iVar1 = Pr<pztopology::TPZPoint>::ContainedSideLocId(side_00,c);
      iVar1 = iVar1 + 3;
    }
    else {
      iVar1 = Pr<pztopology::TPZPoint>::ContainedSideLocId(side_00,c % iVar3);
      iVar1 = (c / iVar3) * 3 + iVar1;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Pr<TFather>::ContainedSideLocId, side = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,side);
    poVar2 = std::operator<<(poVar2," connect = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,c);
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int Pr<TFather>::ContainedSideLocId(int side,int c) {
		int nsconnect = NContainedSides(side);
		if(c >= nsconnect)
		{
			PZError << "Pr<TFather>::ContainedSideLocId, side = " << side << " connect = " << c << endl;
			return -1;
		}
		int ftns = side/TFather::NSides;
		int fatherside = side%TFather::NSides;
		if(ftns == 0) return TFather::ContainedSideLocId(fatherside,c);
		if(ftns == 1) return TFather::ContainedSideLocId(fatherside,c)+TFather::NSides;
		int nsideconfather = TFather::NContainedSides(fatherside);
		int confather = c%nsideconfather;
		int level = c/nsideconfather;
		return TFather::ContainedSideLocId(fatherside,confather)+level*TFather::NSides;
	}